

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.h
# Opt level: O0

Break * __thiscall CFG::RelooperBuilder::makeBlockBreak(RelooperBuilder *this,int id)

{
  Break *pBVar1;
  Name name;
  int id_local;
  RelooperBuilder *this_local;
  
  name = getBlockBreakName(this,id);
  pBVar1 = ::wasm::Builder::makeBreak(&this->super_Builder,name,(Expression *)0x0,(Expression *)0x0)
  ;
  return pBVar1;
}

Assistant:

wasm::Break* makeBlockBreak(int id) {
    return wasm::Builder::makeBreak(getBlockBreakName(id));
  }